

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
FindEntry<Js::Type>(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
                    *this,Type *key,hash_t hash,uint *bucket,int *previous)

{
  bool bVar1;
  BOOL BVar2;
  int **ppiVar3;
  WeakRefDictionaryEntry<Js::Type,_bool> **ppWVar4;
  RecyclerWeakReference<Js::Type> *pRVar5;
  Type *local_48;
  Type *strongRef;
  int i;
  BOOL inSweep;
  int *previous_local;
  uint *bucket_local;
  hash_t hash_local;
  Type *key_local;
  WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this_local
  ;
  
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar3 != (int *)0x0) {
    BVar2 = Memory::Recycler::IsSweeping(this->recycler);
    *previous = -1;
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
    strongRef._0_4_ = (*ppiVar3)[*bucket];
    while (-1 < (int)strongRef) {
      ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                          ((WriteBarrierPtr *)&this->entries);
      if ((*ppWVar4)[(int)strongRef].hash == hash) {
        if (BVar2 == 0) {
          ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                              ((WriteBarrierPtr *)&this->entries);
          pRVar5 = Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::Type>_>::
                   operator->(&(*ppWVar4)[(int)strongRef].key);
          local_48 = Memory::RecyclerWeakReference<Js::Type>::FastGet(pRVar5);
        }
        else {
          ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                              ((WriteBarrierPtr *)&this->entries);
          pRVar5 = Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<Js::Type>_>::
                   operator->(&(*ppWVar4)[(int)strongRef].key);
          local_48 = Memory::RecyclerWeakReference<Js::Type>::Get(pRVar5);
        }
        if (local_48 != (Type *)0x0) {
          bVar1 = DefaultComparer<const_Js::Type_*>::Equals(local_48,key);
          if (bVar1) {
            return (int)strongRef;
          }
          goto LAB_00ad41d2;
        }
        strongRef._0_4_ = RemoveEntry(this,(int)strongRef,*previous,*bucket);
      }
      else {
LAB_00ad41d2:
        *previous = (int)strongRef;
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        strongRef._0_4_ = (*ppWVar4)[(int)strongRef].next;
      }
    }
  }
  return -1;
}

Assistant:

inline int FindEntry(const TLookup* key, hash_t const hash, uint& bucket, int& previous)
        {
            if (buckets != nullptr)
            {
                BOOL inSweep = this->recycler->IsSweeping();
                previous = -1;
                for (int i = buckets[bucket]; i >= 0; )
                {
                    if (entries[i].hash == hash)
                    {
                        TKey* strongRef = nullptr;

                        if (!inSweep)
                        {
                            // Quickly check for null if we're not in sweep- if it's null, it's definitely been collected
                            // so remove
                            strongRef = entries[i].key->FastGet();
                        }
                        else
                        {
                            // If we're in sweep, use the slower Get which checks if the object is getting collected
                            // This could return null too but we won't clean it up now, we'll clean it up later
                            strongRef = entries[i].key->Get();
                        }

                        if (strongRef == nullptr)
                        {
                            i = RemoveEntry(i, previous, bucket);
                            continue;
                        }
                        else
                        {
                            // if we get here, strongRef is not null
                            if (KeyComparer::Equals(strongRef, key))
                                return i;
                        }
                    }

                    previous = i;
                    i = entries[i].next;
                }
            }
            return -1;
        }